

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.h
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::EvaluateSectionFrame
          (ChElementBeamIGA *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint i;
  double *pdVar5;
  pointer psVar6;
  element_type *peVar7;
  long lVar8;
  pointer psVar9;
  ulong uVar10;
  pointer psVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar18;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ChVectorDynamic<> N;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  double local_38;
  double local_30;
  double local_28;
  undefined1 auVar17 [64];
  
  i = this->order;
  lVar12 = (long)(int)i;
  if ((-1 < lVar12) &&
     (uVar10 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows, lVar12 < (long)uVar10)) {
    lVar8 = uVar10 + (long)(int)~i;
    local_28 = eta;
    if ((-1 < lVar8) && (CARRY8(uVar10,(long)(int)~i))) {
      pdVar5 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      local_30 = pdVar5[lVar12];
      local_38 = pdVar5[lVar8];
      local_48.m_storage.m_data = (double *)0x0;
      local_48.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_48,
                 (long)(int)((ulong)((long)(this->nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4));
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_30;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_38 - local_30;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = (local_28 + 1.0) * 0.5;
      auVar15 = vfmadd213sd_fma(auVar15,auVar19,auVar21);
      geometry::ChBasisToolsBspline::BasisEvaluate
                (this->order,i,auVar15._0_8_,&this->knots,(ChVectorDynamic<> *)&local_48);
      if (point != (ChVector<double> *)&VNULL) {
        point->m_data[0] = VNULL;
        point->m_data[1] = DAT_00b689a0;
        point->m_data[2] = DAT_00b689a8;
      }
      psVar6 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar9 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)psVar6 - (long)psVar9 >> 4;
      if (psVar6 != psVar9) {
        dVar13 = point->m_data[0];
        dVar18 = point->m_data[1];
        dVar14 = point->m_data[2];
        uVar10 = 0;
        psVar11 = psVar9;
        do {
          if ((~(local_48.m_storage.m_rows >> 0x3f) & local_48.m_storage.m_rows) == uVar10)
          goto LAB_0068f29b;
          peVar7 = (psVar11->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          dVar28 = local_48.m_storage.m_data[uVar10];
          uVar10 = uVar10 + 1;
          psVar11 = psVar11 + 1;
          dVar13 = dVar28 * *(double *)&(peVar7->super_ChNodeFEAbase).field_0x20 + dVar13;
          dVar18 = dVar28 * *(double *)&peVar7->field_0x28 + dVar18;
          dVar14 = dVar28 * *(double *)&peVar7->field_0x30 + dVar14;
          point->m_data[0] = dVar13;
          point->m_data[1] = dVar18;
          point->m_data[2] = dVar14;
        } while (lVar12 + (ulong)(lVar12 == 0) != uVar10);
      }
      if (rot != (ChQuaternion<double> *)&QNULL) {
        rot->m_data[0] = QNULL;
        rot->m_data[1] = DAT_00b68838;
        rot->m_data[2] = DAT_00b68840;
        rot->m_data[3] = DAT_00b68848;
      }
      auVar17 = ZEXT864((ulong)rot->m_data[0]);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = rot->m_data[0];
      if (psVar6 == psVar9) {
        dVar14 = rot->m_data[1];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = rot->m_data[2];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = rot->m_data[3];
      }
      else {
        auVar20 = ZEXT864((ulong)rot->m_data[1]);
        auVar23 = ZEXT864((ulong)rot->m_data[2]);
        auVar25 = ZEXT864((ulong)rot->m_data[3]);
        uVar10 = 0;
        do {
          if ((~(local_48.m_storage.m_rows >> 0x3f) & local_48.m_storage.m_rows) == uVar10)
          goto LAB_0068f29b;
          peVar7 = (psVar9->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_48.m_storage.m_data[uVar10];
          psVar9 = psVar9 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)&peVar7->field_0x38;
          auVar16 = vfmadd231sd_fma(auVar17._0_16_,auVar31,auVar1);
          auVar17 = ZEXT1664(auVar16);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)&peVar7->field_0x50;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)&peVar7->field_0x40;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)&peVar7->field_0x48;
          rot->m_data[0] = auVar16._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_48.m_storage.m_data[uVar10];
          auVar15 = vfmadd231sd_fma(auVar20._0_16_,auVar29,auVar2);
          auVar20 = ZEXT1664(auVar15);
          dVar14 = auVar15._0_8_;
          rot->m_data[1] = dVar14;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_48.m_storage.m_data[uVar10];
          auVar22 = vfmadd231sd_fma(auVar23._0_16_,auVar30,auVar3);
          auVar23 = ZEXT1664(auVar22);
          rot->m_data[2] = auVar22._0_8_;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_48.m_storage.m_data[uVar10];
          auVar24 = vfmadd231sd_fma(auVar25._0_16_,auVar26,auVar4);
          auVar25 = ZEXT1664(auVar24);
          uVar10 = uVar10 + 1;
          rot->m_data[3] = auVar24._0_8_;
        } while (lVar12 + (ulong)(lVar12 == 0) != uVar10);
      }
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar14 * dVar14;
      auVar15 = vfmadd231sd_fma(auVar27,auVar16,auVar16);
      auVar15 = vfmadd231sd_fma(auVar15,auVar22,auVar22);
      auVar15 = vfmadd231sd_fma(auVar15,auVar24,auVar24);
      auVar15 = vsqrtsd_avx(auVar15,auVar15);
      if (auVar15._0_8_ < 2.2250738585072014e-308) {
        dVar13 = 1.0;
        dVar14 = 0.0;
        dVar18 = 0.0;
        dVar28 = 0.0;
      }
      else {
        dVar28 = 1.0 / auVar15._0_8_;
        dVar13 = auVar16._0_8_ * dVar28;
        dVar14 = dVar14 * dVar28;
        dVar18 = auVar22._0_8_ * dVar28;
        dVar28 = auVar24._0_8_ * dVar28;
      }
      rot->m_data[0] = dVar13;
      rot->m_data[1] = dVar14;
      rot->m_data[2] = dVar18;
      rot->m_data[3] = dVar28;
      if (local_48.m_storage.m_data != (double *)0x0) {
        free((void *)local_48.m_storage.m_data[-1]);
      }
      return;
    }
  }
LAB_0068f29b:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual void EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) override {
        // compute parameter in knot space from eta-1..+1

        double u1 = knots(order);  // extreme of span
        double u2 = knots(knots.size() - order - 1);
        double u = u1 + ((eta + 1) / 2.0) * (u2 - u1);
        int nspan = order;

        ChVectorDynamic<> N((int)nodes.size());

        geometry::ChBasisToolsBspline::BasisEvaluate(this->order, nspan, u, knots,
                                                     N);  ///< here return  in N

        point = VNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            point += N(i) * nodes[i]->coord.pos;
        }
        rot = QNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> myrot = nodes[i]->coord.rot;
            rot.e0() += N(i) * myrot.e0();
            rot.e1() += N(i) * myrot.e1();
            rot.e2() += N(i) * myrot.e2();
            rot.e3() += N(i) * myrot.e3();
        }
        rot.Normalize();
    }